

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::subroutineUniformSet::set
          (subroutineUniformSet *this,GLuint bit_field,subroutineUniformSet *subroutine_indices)

{
  this->m_vertex_shader_stage = subroutine_indices[bit_field & 1].m_vertex_shader_stage;
  this->m_tesselation_control_shader_stage =
       subroutine_indices[bit_field >> 1 & 1].m_tesselation_control_shader_stage;
  this->m_tesselation_evaluation_shader_stage =
       subroutine_indices[bit_field >> 2 & 1].m_tesselation_evaluation_shader_stage;
  this->m_geometry_shader_stage = subroutine_indices[bit_field >> 3 & 1].m_geometry_shader_stage;
  this->m_fragment_shader_stage = subroutine_indices[bit_field >> 4 & 1].m_fragment_shader_stage;
  return;
}

Assistant:

void FunctionalTest20_21::subroutineUniformSet::set(GLuint bit_field, const subroutineUniformSet subroutine_indices[2])
{
	GLuint vertex_stage					= ((bit_field & (0x01 << 0)) >> 0);
	GLuint tesselation_control_stage	= ((bit_field & (0x01 << 1)) >> 1);
	GLuint tesselation_evaluation_stage = ((bit_field & (0x01 << 2)) >> 2);
	GLuint geometry_stage				= ((bit_field & (0x01 << 3)) >> 3);
	GLuint fragment_stage				= ((bit_field & (0x01 << 4)) >> 4);

	m_vertex_shader_stage = subroutine_indices[vertex_stage].m_vertex_shader_stage;
	m_tesselation_control_shader_stage =
		subroutine_indices[tesselation_control_stage].m_tesselation_control_shader_stage;
	m_tesselation_evaluation_shader_stage =
		subroutine_indices[tesselation_evaluation_stage].m_tesselation_evaluation_shader_stage;
	m_geometry_shader_stage = subroutine_indices[geometry_stage].m_geometry_shader_stage;
	m_fragment_shader_stage = subroutine_indices[fragment_stage].m_fragment_shader_stage;
}